

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::
DescriptorPoolMemoizationTest_MemoizeProjectionMultithreaded_Test::TestBody
          (DescriptorPoolMemoizationTest_MemoizeProjectionMultithreaded_Test *this)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  Descriptor *this_00;
  thread *thread;
  iterator __end2;
  iterator __begin2;
  vector<std::thread,_std::allocator<std::thread>_> *__range2;
  Descriptor *local_3a0;
  int local_398;
  int local_38c;
  undefined1 local_388 [4];
  int i;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  Descriptor *descriptor;
  TestAllTypes message;
  anon_class_1_0_00000001_for_name_lambda name_lambda;
  DescriptorPoolMemoizationTest_MemoizeProjectionMultithreaded_Test *this_local;
  
  proto2_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)&descriptor);
  this_00 = proto2_unittest::TestAllTypes::GetDescriptor();
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)local_388);
  local_38c = 0;
  while( true ) {
    iVar1 = local_38c;
    iVar3 = Descriptor::field_count(this_00);
    if (iVar3 <= iVar1) break;
    local_398 = local_38c;
    __range2 = (vector<std::thread,_std::allocator<std::thread>_> *)this;
    local_3a0 = this_00;
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<google::protobuf::descriptor_unittest::DescriptorPoolMemoizationTest_MemoizeProjectionMultithreaded_Test::TestBody()::__1>
              ((vector<std::thread,std::allocator<std::thread>> *)local_388,(type *)&__range2);
    local_38c = local_38c + 1;
  }
  __end2 = std::vector<std::thread,_std::allocator<std::thread>_>::begin
                     ((vector<std::thread,_std::allocator<std::thread>_> *)local_388);
  thread = (thread *)
           std::vector<std::thread,_std::allocator<std::thread>_>::end
                     ((vector<std::thread,_std::allocator<std::thread>_> *)local_388);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                *)&thread);
    if (!bVar2) break;
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator*(&__end2);
    std::thread::join();
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator++(&__end2);
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)local_388);
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)&descriptor);
  return;
}

Assistant:

TEST_F(DescriptorPoolMemoizationTest, MemoizeProjectionMultithreaded) {
  auto name_lambda = [](const FieldDescriptor* field) {
    return field->full_name();
  };
  proto2_unittest::TestAllTypes message;
  const Descriptor* descriptor = message.GetDescriptor();
  std::vector<std::thread> threads;
  for (int i = 0; i < descriptor->field_count(); ++i) {
    threads.emplace_back([this, name_lambda, descriptor, i]() {
      auto name = DescriptorPoolMemoizationTest::MemoizeProjection(
          descriptor->field(i), name_lambda);
      auto first_name = DescriptorPoolMemoizationTest::MemoizeProjection(
          descriptor->field(0), name_lambda);
      ASSERT_THAT(name, HasSubstr("proto2_unittest.TestAllTypes"));
      if (i != 0) {
        ASSERT_NE(name, "proto2_unittest.TestAllTypes.optional_int32");
      }
      ASSERT_EQ(first_name, "proto2_unittest.TestAllTypes.optional_int32");
    });
  }
  for (auto& thread : threads) {
    thread.join();
  }
}